

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O2

void __thiscall amrex::ForkJoin::modify_ngrow(ForkJoin *this,string *name,int idx,IntVect ngrow)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *this_00;
  pointer pMVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  int i;
  long lVar4;
  undefined8 local_48;
  int local_40;
  long local_38;
  
  local_40 = ngrow.vect[2];
  local_48 = ngrow.vect._0_8_;
  this_00 = &this->data;
  sVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&this_00->_M_h,name);
  lVar4 = (long)idx;
  if (sVar2 != 0) {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,name);
    if (lVar4 < ((long)(pmVar3->
                       super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                       ).
                       super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pmVar3->
                      super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                      ).
                      super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x50) goto LAB_004f9c10;
  }
  Assert_host("data.count(name) > 0 && data[name].size() > idx",
              "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
              ,0x90,"\"(name, index) pair doesn\'t exist\"");
LAB_004f9c10:
  local_38 = lVar4;
  if (this->flag_invoked == true) {
    Assert_host("!flag_invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
                ,0x92,"\"Can only specify grow cells before first forkjoin() invocation\"");
  }
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    if (*(int *)((long)&local_48 + lVar4 * 4) < 0) {
      Assert_host("ngrow[i] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
                  ,0x95,"\"ngrow[i] must be non-negative\"");
    }
  }
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,name);
  pMVar1 = (pmVar3->super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>)
           .super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pMVar1[local_38].ngrow.vect = local_48;
  *(int *)((long)pMVar1[local_38].ngrow.vect + 8) = local_40;
  return;
}

Assistant:

void
ForkJoin::modify_ngrow (const std::string &name, int idx, IntVect ngrow)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(data.count(name) > 0 && data[name].size() > idx,
                                     "(name, index) pair doesn't exist");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!flag_invoked,
                                     "Can only specify grow cells before first forkjoin() invocation");
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(ngrow[i] >= 0,
                                         "ngrow[i] must be non-negative");
    }
    data[name][idx].ngrow = ngrow;
}